

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O3

SUNErrCode SUNLogger_CreateFromEnv(SUNComm comm,SUNLogger *logger_out)

{
  SUNLogger logger_00;
  int output_rank;
  SUNErrCode SVar1;
  SUNErrCode SVar2;
  char *pcVar3;
  char *warning_filename;
  SUNLogger logger;
  SUNLogger local_30;
  
  local_30 = (SUNLogger)0x0;
  pcVar3 = getenv("SUNLOGGER_OUTPUT_RANK");
  if (pcVar3 == (char *)0x0) {
    output_rank = 0;
  }
  else {
    output_rank = atoi(pcVar3);
  }
  pcVar3 = getenv("SUNLOGGER_ERROR_FILENAME");
  warning_filename = getenv("SUNLOGGER_WARNING_FILENAME");
  getenv("SUNLOGGER_INFO_FILENAME");
  getenv("SUNLOGGER_DEBUG_FILENAME");
  SVar1 = SUNLogger_Create(comm,output_rank,&local_30);
  logger_00 = local_30;
  SVar2 = -0x2709;
  if (SVar1 == 0) {
    SVar2 = SUNLogger_SetErrorFilename(local_30,pcVar3);
    if ((SVar2 == 0) &&
       (SVar2 = SUNLogger_SetWarningFilename(logger_00,warning_filename), SVar2 == 0)) {
      if (logger_00 != (SUNLogger)0x0) {
        *logger_out = logger_00;
        return 0;
      }
      SVar2 = -9999;
    }
    SUNLogger_Destroy(&local_30);
  }
  return SVar2;
}

Assistant:

SUNErrCode SUNLogger_CreateFromEnv(SUNComm comm, SUNLogger* logger_out)
{
  SUNErrCode err   = SUN_SUCCESS;
  SUNLogger logger = NULL;

  const char* output_rank_env   = getenv("SUNLOGGER_OUTPUT_RANK");
  int output_rank               = (output_rank_env) ? atoi(output_rank_env) : 0;
  const char* error_fname_env   = getenv("SUNLOGGER_ERROR_FILENAME");
  const char* warning_fname_env = getenv("SUNLOGGER_WARNING_FILENAME");
  const char* info_fname_env    = getenv("SUNLOGGER_INFO_FILENAME");
  const char* debug_fname_env   = getenv("SUNLOGGER_DEBUG_FILENAME");

  if (SUNLogger_Create(comm, output_rank, &logger))
  {
    err = SUN_ERR_CORRUPT;
    return err;
  }

  do {
    err = SUNLogger_SetErrorFilename(logger, error_fname_env);
    if (err) { break; }
    err = SUNLogger_SetWarningFilename(logger, warning_fname_env);
    if (err) { break; }
    err = SUNLogger_SetDebugFilename(logger, debug_fname_env);
    if (err) { break; }
    err = SUNLogger_SetInfoFilename(logger, info_fname_env);
  }
  while (0);

  if (err) { SUNLogger_Destroy(&logger); }
  else { *logger_out = logger; }

  return err;
}